

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O0

Pig * __thiscall Pig::dump_abi_cxx11_(Pig *this)

{
  ostream *poVar1;
  element_type *peVar2;
  ulong uVar3;
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RSI;
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream out;
  ostream local_190 [384];
  Pig *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (*(long *)(in_RSI + 0x10) != 0) {
    poVar1 = std::operator<<(local_190,"\x1b[37;42m");
    peVar2 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(in_RSI);
    std::__cxx11::string::substr((ulong)local_1d0,(ulong)peVar2);
    poVar1 = std::operator<<(poVar1,local_1d0);
    std::operator<<(poVar1,"\x1b[0m");
    std::__cxx11::string::~string(local_1d0);
  }
  poVar1 = std::operator<<(local_190,"\x1b[37;41m");
  peVar2 = std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(in_RSI);
  std::__cxx11::string::substr((ulong)local_1f0,(ulong)peVar2);
  poVar1 = std::operator<<(poVar1,local_1f0);
  poVar1 = std::operator<<(poVar1,"\x1b[0m ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x10));
  poVar1 = std::operator<<(poVar1,'/');
  std::
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(in_RSI);
  uVar3 = std::__cxx11::string::length();
  std::ostream::operator<<(poVar1,uVar3);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"\n",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"\\n",&local_259);
  str_replace((string *)this,local_210,(string *)local_230);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string Pig::dump () const
{
  std::stringstream out;
  if (_cursor)
    out << "[37;42m"
        << _text->substr (0, _cursor)
        << "[0m";

  out << "[37;41m"
      << _text->substr (_cursor)
      << "[0m "
      << _cursor
      << '/'
      << _text->length ();

  return str_replace (out.str (), "\n", "\\n");
}